

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O2

void __thiscall xray_re::xr_reader::r_sz(xr_reader *this,string *value)

{
  uchar *__first;
  uchar *puVar1;
  uchar *__last;
  uchar *puVar2;
  
  __first = (this->field_2).m_p;
  __last = this->m_end;
  puVar1 = __first;
  if (__last <= __first) {
    __assert_fail("p < m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                  ,0x8b,"void xray_re::xr_reader::r_sz(std::string &)");
  }
  do {
    if (*puVar1 == '\0') {
      __last = puVar1;
      puVar2 = puVar1 + 1;
      break;
    }
    puVar1 = puVar1 + 1;
    puVar2 = __last;
  } while (puVar1 < __last);
  std::__cxx11::string::assign<unsigned_char_const*,void>((string *)value,__first,__last);
  (this->field_2).m_p = puVar2;
  return;
}

Assistant:

void xr_reader::r_sz(std::string& value)
{
	const uint8_t* p = m_p;
	xr_assert(p < m_end);
	while (*p++) {
		// FIXME: we should crash in debug mode if no '\0' in the chunk,
		// but that is not good for older models (from 2215).
		// update: OGF_S_LODS 
		// assert(p < m_end);
		if (p >= m_end) {
			value.assign(m_p, p);
			m_p = p;
			return;
		}
	}
	value.assign(m_p, p - 1);
	m_p = p;
}